

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

bool __thiscall
libcellml::Variable::VariableImpl::unsetEquivalentTo
          (VariableImpl *this,VariablePtr *equivalentVariable)

{
  bool bVar1;
  _Self local_a0;
  weak_ptr<libcellml::Variable> local_98;
  _Self local_88;
  iterator connectionIdResult;
  _Self local_70 [3];
  weak_ptr<libcellml::Variable> local_58;
  _Self local_48;
  iterator mappingIdResult;
  const_iterator local_38;
  __normal_iterator<std::weak_ptr<libcellml::Variable>_*,_std::vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>_>
  local_30;
  __normal_iterator<std::weak_ptr<libcellml::Variable>_*,_std::vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>_>
  local_28;
  iterator result;
  bool status;
  VariablePtr *equivalentVariable_local;
  VariableImpl *this_local;
  
  cleanExpiredVariables(this);
  result._M_current._7_1_ = 0;
  local_28._M_current =
       (weak_ptr<libcellml::Variable> *)findEquivalentVariable(this,equivalentVariable);
  local_30._M_current =
       (weak_ptr<libcellml::Variable> *)
       std::
       vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
       ::end(&this->mEquivalentVariables);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<libcellml::Variable>const*,std::vector<std::weak_ptr<libcellml::Variable>,std::allocator<std::weak_ptr<libcellml::Variable>>>>
    ::__normal_iterator<std::weak_ptr<libcellml::Variable>*>
              ((__normal_iterator<std::weak_ptr<libcellml::Variable>const*,std::vector<std::weak_ptr<libcellml::Variable>,std::allocator<std::weak_ptr<libcellml::Variable>>>>
                *)&local_38,&local_28);
    mappingIdResult._M_node =
         (_Base_ptr)
         std::
         vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
         ::erase(&this->mEquivalentVariables,local_38);
    std::weak_ptr<libcellml::Variable>::weak_ptr<libcellml::Variable,void>
              (&local_58,equivalentVariable);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->mMappingIdMap,&local_58);
    std::weak_ptr<libcellml::Variable>::~weak_ptr(&local_58);
    local_70[0]._M_node =
         (_Base_ptr)
         std::
         map<std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->mMappingIdMap);
    bVar1 = std::operator!=(&local_48,local_70);
    if (bVar1) {
      connectionIdResult =
           std::
           map<std::weak_ptr<libcellml::Variable>,std::__cxx11::string,std::owner_less<std::weak_ptr<libcellml::Variable>>,std::allocator<std::pair<std::weak_ptr<libcellml::Variable>const,std::__cxx11::string>>>
           ::erase_abi_cxx11_((map<std::weak_ptr<libcellml::Variable>,std::__cxx11::string,std::owner_less<std::weak_ptr<libcellml::Variable>>,std::allocator<std::pair<std::weak_ptr<libcellml::Variable>const,std::__cxx11::string>>>
                               *)&this->mMappingIdMap,local_48._M_node);
    }
    std::weak_ptr<libcellml::Variable>::weak_ptr<libcellml::Variable,void>
              (&local_98,equivalentVariable);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->mConnectionIdMap,&local_98);
    std::weak_ptr<libcellml::Variable>::~weak_ptr(&local_98);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->mConnectionIdMap);
    bVar1 = std::operator!=(&local_88,&local_a0);
    if (bVar1) {
      std::
      map<std::weak_ptr<libcellml::Variable>,std::__cxx11::string,std::owner_less<std::weak_ptr<libcellml::Variable>>,std::allocator<std::pair<std::weak_ptr<libcellml::Variable>const,std::__cxx11::string>>>
      ::erase_abi_cxx11_((map<std::weak_ptr<libcellml::Variable>,std::__cxx11::string,std::owner_less<std::weak_ptr<libcellml::Variable>>,std::allocator<std::pair<std::weak_ptr<libcellml::Variable>const,std::__cxx11::string>>>
                          *)&this->mConnectionIdMap,(iterator)local_88._M_node);
    }
    result._M_current._7_1_ = 1;
  }
  return (bool)(result._M_current._7_1_ & 1);
}

Assistant:

bool Variable::VariableImpl::unsetEquivalentTo(const VariablePtr &equivalentVariable)
{
    cleanExpiredVariables();
    bool status = false;
    auto result = findEquivalentVariable(equivalentVariable);
    if (result != mEquivalentVariables.end()) {
        mEquivalentVariables.erase(result);
        auto mappingIdResult = mMappingIdMap.find(equivalentVariable);
        if (mappingIdResult != mMappingIdMap.end()) {
            mMappingIdMap.erase(mappingIdResult);
        }
        auto connectionIdResult = mConnectionIdMap.find(equivalentVariable);
        if (connectionIdResult != mConnectionIdMap.end()) {
            mConnectionIdMap.erase(connectionIdResult);
        }
        status = true;
    }

    return status;
}